

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::format<int,int,int>(char *fmt,int *args,int *args_1,int *args_2)

{
  string *in_RDI;
  ostringstream oss;
  ostringstream local_1a0 [64];
  int *in_stack_fffffffffffffea0;
  int *in_stack_fffffffffffffea8;
  int *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  ostream *in_stack_fffffffffffffec0;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  format<int,int,int>(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                      in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}